

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicg.h
# Opt level: O0

int BiCG<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,int64_t *max_iter,double *tol)

{
  longdouble lVar1;
  longdouble *plVar2;
  TPZMatrix<long_double> *aBase;
  long *in_RCX;
  long *in_RDI;
  long *in_R8;
  double *in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST6;
  longdouble in_ST7;
  REAL RVar6;
  int64_t i;
  TPZFMatrix<long_double> rtilde;
  TPZFMatrix<long_double> r;
  double normb;
  TPZFMatrix<long_double> qtilde;
  TPZFMatrix<long_double> q;
  TPZFMatrix<long_double> ptilde;
  TPZFMatrix<long_double> p;
  TPZFMatrix<long_double> ztilde;
  TPZFMatrix<long_double> z;
  TPZFMatrix<long_double> beta;
  TPZFMatrix<long_double> alpha;
  TPZFMatrix<long_double> rho_2;
  TPZFMatrix<long_double> rho_1;
  double resid;
  TPZFMatrix<long_double> *A_00;
  undefined2 in_stack_fffffffffffff4e0;
  undefined2 uVar7;
  undefined6 in_stack_fffffffffffff4e2;
  TPZFMatrix<long_double> *in_stack_fffffffffffff4e8;
  TPZFMatrix<long_double> *in_stack_fffffffffffff4f0;
  undefined2 in_stack_fffffffffffff4f8;
  undefined2 in_stack_fffffffffffff4fa;
  undefined4 in_stack_fffffffffffff4fc;
  undefined6 uStack_b00;
  TPZFMatrix<long_double> *in_stack_fffffffffffff510;
  TPZFMatrix<long_double> *in_stack_fffffffffffff518;
  TPZFMatrix<long_double> *in_stack_fffffffffffff520;
  TPZFMatrix<long_double> *in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff530;
  undefined4 in_stack_fffffffffffff534;
  undefined4 uVar8;
  undefined6 uStack_ac8;
  TPZFMatrix<long_double> *in_stack_fffffffffffff540;
  TPZFMatrix<long_double> *in_stack_fffffffffffff548;
  long local_7b8;
  undefined1 local_7a8 [288];
  undefined1 local_688 [144];
  double local_5f8;
  undefined1 local_5f0 [288];
  TPZFMatrix<long_double> local_4d0;
  TPZFMatrix<long_double> local_440;
  TPZFMatrix<long_double> local_3b0;
  TPZFMatrix<long_double> local_320;
  TPZFMatrix<long_double> local_290;
  TPZFMatrix<long_double> local_200;
  TPZFMatrix<long_double> local_160;
  TPZFMatrix<long_double> local_d0;
  double local_40;
  double *local_38;
  long *local_30;
  long *local_28;
  long *local_10;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffff520,(int64_t)in_stack_fffffffffffff518,
             (int64_t)in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffff520,(int64_t)in_stack_fffffffffffff518,
             (int64_t)in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffff520,(int64_t)in_stack_fffffffffffff518,
             (int64_t)in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_fffffffffffff520,(int64_t)in_stack_fffffffffffff518,
             (int64_t)in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff510);
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff4e2,in_stack_fffffffffffff4e0));
  uVar7 = (undefined2)((unkuint10)in_ST0 >> 0x40);
  lVar3 = in_ST7;
  local_5f8 = TPZExtractVal::val(in_ST0);
  TPZMatrix<long_double>::operator*
            (&in_stack_fffffffffffff518->super_TPZMatrix<long_double>,in_stack_fffffffffffff510);
  TPZFMatrix<long_double>::operator-(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cd751);
  TPZFMatrix<long_double>::TPZFMatrix
            ((TPZFMatrix<long_double> *)
             CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),in_stack_fffffffffffff528
            );
  if ((local_5f8 == 0.0) && (!NAN(local_5f8))) {
    local_5f8 = 1.0;
  }
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff4e2,uVar7));
  lVar4 = lVar3;
  RVar6 = TPZExtractVal::val(in_ST1);
  local_40 = (double)(-(ulong)(RVar6 / local_5f8 <= *local_38) & 0x3ff0000000000000);
  if ((local_40 != 0.0) || (NAN(local_40))) {
    *local_38 = local_40;
    *local_30 = 0;
    local_4 = 0;
  }
  else {
    for (local_7b8 = 1; local_7b8 <= *local_30; local_7b8 = local_7b8 + 1) {
      (**(code **)(*local_28 + 0x58))(local_28,local_688,&local_320,0);
      (**(code **)(*local_28 + 0x58))(local_28,local_7a8,&local_3b0,0);
      Dot<long_double>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
      plVar2 = TPZFMatrix<long_double>::operator()(&local_d0,0);
      *plVar2 = in_ST2;
      plVar2 = TPZFMatrix<long_double>::operator()(&local_d0,0);
      lVar5 = *plVar2;
      A_00 = SUB108(lVar5,0);
      uVar7 = (undefined2)((unkuint10)lVar5 >> 0x40);
      RVar6 = TPZExtractVal::val(lVar5);
      if ((RVar6 == 0.0) && (!NAN(RVar6))) {
        Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff4e2,uVar7));
        RVar6 = TPZExtractVal::val(in_ST3);
        *local_38 = RVar6 / local_5f8;
        *local_30 = local_7b8;
        local_4 = 2;
        goto LAB_012cdff1;
      }
      if (local_7b8 == 1) {
        TPZFMatrix<long_double>::operator=
                  ((TPZFMatrix<long_double> *)
                   CONCAT44(in_stack_fffffffffffff4fc,
                            CONCAT22(in_stack_fffffffffffff4fa,in_stack_fffffffffffff4f8)),
                   in_stack_fffffffffffff4f0);
        TPZFMatrix<long_double>::operator=
                  ((TPZFMatrix<long_double> *)
                   CONCAT44(in_stack_fffffffffffff4fc,
                            CONCAT22(in_stack_fffffffffffff4fa,in_stack_fffffffffffff4f8)),
                   in_stack_fffffffffffff4f0);
        in_ST2 = in_ST5;
        in_ST5 = lVar3;
      }
      else {
        plVar2 = TPZFMatrix<long_double>::operator()(&local_d0,0);
        lVar5 = *plVar2;
        plVar2 = TPZFMatrix<long_double>::operator()(&local_160,0);
        lVar1 = *plVar2;
        lVar4 = lVar3;
        plVar2 = TPZFMatrix<long_double>::operator()(&local_290,0);
        *plVar2 = lVar5 / lVar1;
        plVar2 = TPZFMatrix<long_double>::operator()(&local_290,0);
        TPZFMatrix<long_double>::TimesBetaPlusZ(&local_440,*plVar2,&local_320);
        plVar2 = TPZFMatrix<long_double>::operator()(&local_290,0);
        lVar5 = *plVar2;
        A_00 = SUB108(lVar5,0);
        uVar7 = (undefined2)((unkuint10)lVar5 >> 0x40);
        TPZFMatrix<long_double>::TimesBetaPlusZ(&local_4d0,lVar5,&local_3b0);
        in_ST2 = in_ST5;
        in_ST5 = lVar3;
      }
      TPZMatrix<long_double>::operator*
                (&in_stack_fffffffffffff518->super_TPZMatrix<long_double>,in_stack_fffffffffffff510)
      ;
      TPZFMatrix<long_double>::operator=
                ((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff4e2,uVar7),A_00);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cdc81);
      (**(code **)(*local_10 + 0x128))(local_10,&local_4d0,local_5f0,1);
      plVar2 = TPZFMatrix<long_double>::operator()(&local_d0,0);
      lVar3 = *plVar2;
      Dot<long_double>(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
      uVar8 = SUB104(lVar3 / in_ST3,0);
      uStack_ac8 = (undefined6)((unkuint10)(lVar3 / in_ST3) >> 0x20);
      lVar5 = lVar4;
      plVar2 = TPZFMatrix<long_double>::operator()(&local_200,0);
      *plVar2 = (longdouble)CONCAT64(uStack_ac8,uVar8);
      aBase = (TPZMatrix<long_double> *)TPZFMatrix<long_double>::operator()(&local_200,0);
      operator*((longdouble)CONCAT28(in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0),
                in_stack_fffffffffffff4e8);
      TPZFMatrix<long_double>::operator+=
                ((TPZFMatrix<long_double> *)CONCAT44(uVar8,in_stack_fffffffffffff530),aBase);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cdd80);
      TPZFMatrix<long_double>::operator()(&local_200,0);
      operator*((longdouble)CONCAT28(in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0),
                in_stack_fffffffffffff4e8);
      TPZFMatrix<long_double>::operator-=
                ((TPZFMatrix<long_double> *)CONCAT44(uVar8,in_stack_fffffffffffff530),aBase);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cdddf);
      in_stack_fffffffffffff518 =
           (TPZFMatrix<long_double> *)TPZFMatrix<long_double>::operator()(&local_200,0);
      uVar7 = (undefined2)
              ((unkuint10)
               *(longdouble *)
                &(in_stack_fffffffffffff518->super_TPZMatrix<long_double>).super_TPZBaseMatrix >>
              0x40);
      operator*((longdouble)CONCAT28(in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0),
                in_stack_fffffffffffff4e8);
      TPZFMatrix<long_double>::operator-=
                ((TPZFMatrix<long_double> *)CONCAT44(uVar8,in_stack_fffffffffffff530),aBase);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cde3e);
      in_stack_fffffffffffff510 =
           (TPZFMatrix<long_double> *)TPZFMatrix<long_double>::operator()(&local_d0,0);
      lVar3 = *(longdouble *)
               &(in_stack_fffffffffffff510->super_TPZMatrix<long_double>).super_TPZBaseMatrix;
      in_stack_fffffffffffff4fc = SUB104(lVar3,0);
      uStack_b00 = (undefined6)((unkuint10)lVar3 >> 0x20);
      plVar2 = TPZFMatrix<long_double>::operator()(&local_160,0);
      *plVar2 = (longdouble)CONCAT64(uStack_b00,in_stack_fffffffffffff4fc);
      in_ST3 = in_ST6;
      in_ST6 = lVar4;
      lVar3 = lVar5;
      Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff4e2,uVar7));
      in_stack_fffffffffffff4f0 = SUB108(in_ST4,0);
      in_stack_fffffffffffff4f8 = (undefined2)((unkuint10)in_ST4 >> 0x40);
      lVar4 = lVar3;
      RVar6 = TPZExtractVal::val(in_ST4);
      local_40 = RVar6 / local_5f8;
      if (local_40 < *local_38) {
        *local_38 = local_40;
        *local_30 = local_7b8;
        local_4 = 0;
        goto LAB_012cdff1;
      }
      in_ST4 = in_ST7;
      in_ST7 = lVar5;
    }
    *local_38 = local_40;
    local_4 = 1;
  }
LAB_012cdff1:
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cdffe);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce00b);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce018);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce025);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce032);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce03f);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce04c);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce059);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce066);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce073);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce080);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce08d);
  return local_4;
}

Assistant:

int 
BiCG( Matrix &A, Vector &x, const Vector &b,
     Preconditioner &M, int64_t &max_iter, Real &tol)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1);
	Vector z, ztilde, p, ptilde, q, qtilde;
	
	Real normb = TPZExtractVal::val(Norm(b));
	Vector r = b - A * x;
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = (TPZExtractVal::val(Norm(r)) / normb) <= tol)) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
		M.Solve(rtilde,ztilde);
		rho_1(0) = Dot(z, rtilde);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = (TPZExtractVal::val(Norm(r))) / normb;
			max_iter = i;
			return 2;
		}
		if (i == 1) {
			p = z;
			ptilde = ztilde;
		} else {
			beta(0) = rho_1(0) / rho_2(0);
			p.TimesBetaPlusZ(beta(0),z);
			ptilde.TimesBetaPlusZ(beta(0),ztilde);
		}
		q = A * p;
		A.Multiply(ptilde,qtilde,1);
		alpha(0) = rho_1(0) / Dot(ptilde, q);
		x += alpha(0) * p;
		r -= alpha(0) * q;
		rtilde -= alpha(0) * qtilde;
		
		rho_2(0) = rho_1(0);
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
	}
	
	tol = resid;
	return 1;
}